

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O0

vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_> *
__thiscall
mocker::detail::MoveInfo::freezeMoves
          (vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
           *__return_storage_ptr__,MoveInfo *this,Node *n)

{
  bool bVar1;
  reference __args;
  iterator iVar2;
  shared_ptr<mocker::nasm::Mov> *mov;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
  *__range2;
  allocator<std::shared_ptr<mocker::nasm::Mov>_> local_51;
  __normal_iterator<std::shared_ptr<mocker::nasm::Mov>_*,_std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>
  local_50;
  __normal_iterator<std::shared_ptr<mocker::nasm::Mov>_*,_std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>
  local_48;
  undefined1 local_39;
  undefined1 local_38 [8];
  vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
  movs;
  Node *n_local;
  MoveInfo *this_local;
  vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
  *res;
  
  movs.
  super__Vector_base<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)n;
  getCurAssociatedMoves
            ((vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
              *)local_38,this,n);
  local_39 = 0;
  local_48._M_current =
       (shared_ptr<mocker::nasm::Mov> *)
       std::
       vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
       ::begin((vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
                *)local_38);
  local_50._M_current =
       (shared_ptr<mocker::nasm::Mov> *)
       std::
       vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
       ::end((vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
              *)local_38);
  std::allocator<std::shared_ptr<mocker::nasm::Mov>_>::allocator(&local_51);
  std::vector<std::shared_ptr<mocker::nasm::Mov>,std::allocator<std::shared_ptr<mocker::nasm::Mov>>>
  ::
  vector<__gnu_cxx::__normal_iterator<std::shared_ptr<mocker::nasm::Mov>*,std::vector<std::shared_ptr<mocker::nasm::Mov>,std::allocator<std::shared_ptr<mocker::nasm::Mov>>>>,void>
            ((vector<std::shared_ptr<mocker::nasm::Mov>,std::allocator<std::shared_ptr<mocker::nasm::Mov>>>
              *)__return_storage_ptr__,local_48,local_50,&local_51);
  std::allocator<std::shared_ptr<mocker::nasm::Mov>_>::~allocator(&local_51);
  __end2 = std::
           vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
           ::begin((vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
                    *)local_38);
  mov = (shared_ptr<mocker::nasm::Mov> *)
        std::
        vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
        ::end((vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
               *)local_38);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<mocker::nasm::Mov>_*,_std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>
                                     *)&mov), bVar1) {
    __args = __gnu_cxx::
             __normal_iterator<std::shared_ptr<mocker::nasm::Mov>_*,_std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>
             ::operator*(&__end2);
    std::
    unordered_set<std::shared_ptr<mocker::nasm::Mov>,mocker::nasm::InstPtrHash,mocker::nasm::InstPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Mov>>>
    ::emplace<std::shared_ptr<mocker::nasm::Mov>&>
              ((unordered_set<std::shared_ptr<mocker::nasm::Mov>,mocker::nasm::InstPtrHash,mocker::nasm::InstPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Mov>>>
                *)&this->frozen,__args);
    bVar1 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,mocker::nasm::InstPtrHash,mocker::nasm::InstPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Mov>>>,std::shared_ptr<mocker::nasm::Mov>>
                      (&this->active,__args);
    if (bVar1) {
      iVar2 = std::
              unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
              ::find(&this->active,__args);
      std::
      unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
      ::erase(&this->active,iVar2);
    }
    else {
      iVar2 = std::
              unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
              ::find(&this->worklist,__args);
      std::
      unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
      ::erase(&this->worklist,iVar2);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<mocker::nasm::Mov>_*,_std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>
    ::operator++(&__end2);
  }
  local_39 = 1;
  std::
  vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>::
  ~vector((vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
           *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<MovInst> MoveInfo::freezeMoves(const Node &n) {
  auto movs = getCurAssociatedMoves(n);
  std::vector<MovInst> res(movs.begin(), movs.end());

  for (auto &mov : movs) {
    frozen.emplace(mov);
    if (isIn(active, mov))
      active.erase(active.find(mov));
    else
      worklist.erase(worklist.find(mov));
  }

  return res;
}